

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O2

uint64 __thiscall crnlib::data_stream::skip(data_stream *this,uint64 len)

{
  uint uVar1;
  ulong uVar2;
  uint64 uVar3;
  ulong uVar4;
  uint8 buf [1024];
  undefined1 auStack_438 [1032];
  
  uVar3 = 0;
  do {
    if (len == 0) {
      return uVar3;
    }
    uVar4 = 0x400;
    if (len < 0x400) {
      uVar4 = len;
    }
    uVar1 = (*this->_vptr_data_stream[4])(this,auStack_438,uVar4 & 0xffffffff);
    uVar2 = (ulong)uVar1;
    uVar3 = uVar3 + uVar2;
    len = len - uVar2;
  } while (uVar4 == uVar2);
  return uVar3;
}

Assistant:

uint64 data_stream::skip(uint64 len) {
  uint64 total_bytes_read = 0;

  const uint cBufSize = 1024;
  uint8 buf[cBufSize];

  while (len) {
    const uint64 bytes_to_read = math::minimum<uint64>(sizeof(buf), len);
    const uint64 bytes_read = read(buf, static_cast<uint>(bytes_to_read));
    total_bytes_read += bytes_read;

    if (bytes_read != bytes_to_read)
      break;

    len -= bytes_read;
  }

  return total_bytes_read;
}